

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

ShaderResourceUsage *
deqp::gles31::Functional::getShaderResourceUsage
          (ShaderResourceUsage *__return_storage_ptr__,Program *program,Shader *shader)

{
  ShaderType SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  long lVar10;
  _func_int_DataType *dTypeMap;
  Shader *shader_00;
  pointer pVVar11;
  int iVar12;
  long lVar13;
  
  iVar12 = 0;
  iVar2 = anon_unknown_3::getNumTypeInstances
                    (shader,STORAGE_IN,anon_unknown_3::dummyTrueConstantTypeFilter);
  __return_storage_ptr__->numInputs = iVar2;
  iVar3 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_IN,anon_unknown_3::getNumDataTypeVectors);
  __return_storage_ptr__->numInputVectors = iVar3;
  iVar4 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_IN,anon_unknown_3::getNumDataTypeComponents);
  __return_storage_ptr__->numInputComponents = iVar4;
  iVar5 = anon_unknown_3::getNumTypeInstances
                    (shader,STORAGE_OUT,anon_unknown_3::dummyTrueConstantTypeFilter);
  __return_storage_ptr__->numOutputs = iVar5;
  iVar6 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_OUT,anon_unknown_3::getNumDataTypeVectors);
  __return_storage_ptr__->numOutputVectors = iVar6;
  iVar7 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_OUT,anon_unknown_3::getNumDataTypeComponents);
  __return_storage_ptr__->numOutputComponents = iVar7;
  iVar8 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_PATCH_IN,anon_unknown_3::getNumDataTypeComponents);
  __return_storage_ptr__->numPatchInputComponents = iVar8;
  dTypeMap = (_func_int_DataType *)0x6;
  iVar8 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_PATCH_OUT,anon_unknown_3::getNumDataTypeComponents);
  __return_storage_ptr__->numPatchOutputComponents = iVar8;
  pVVar11 = (shader->m_defaultBlock).variables.
            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(shader->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar11) >> 5) *
          -0x55555555) {
    lVar13 = 0;
    lVar10 = 0x20;
    iVar12 = 0;
    do {
      if (*(int *)((long)pVVar11 + lVar10 + -8) == 3) {
        iVar8 = (anonymous_namespace)::accumulateComplexType<int(glu::DataType)>
                          ((VarType *)((long)&(pVVar11->layout).location + lVar10),dTypeMap);
        iVar12 = iVar12 + iVar8;
      }
      lVar13 = lVar13 + 1;
      pVVar11 = (shader->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x60;
    } while (lVar13 < (int)((ulong)((long)(shader->m_defaultBlock).variables.
                                          super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar11
                                   ) >> 5) * -0x55555555);
  }
  __return_storage_ptr__->numDefaultBlockUniformComponents = iVar12;
  iVar8 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeComponents);
  __return_storage_ptr__->numCombinedUniformComponents = iVar8;
  iVar8 = anon_unknown_3::accumulateShaderStorage
                    (shader,STORAGE_UNIFORM,anon_unknown_3::getNumDataTypeVectors);
  __return_storage_ptr__->numUniformVectors = iVar8;
  iVar8 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeSampler);
  __return_storage_ptr__->numSamplers = iVar8;
  shader_00 = (Shader *)0x3;
  iVar8 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeImage);
  __return_storage_ptr__->numImages = iVar8;
  iVar8 = anon_unknown_3::getNumAtomicCounterBuffers((anon_unknown_3 *)shader,shader_00);
  __return_storage_ptr__->numAtomicCounterBuffers = iVar8;
  iVar8 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter);
  __return_storage_ptr__->numAtomicCounters = iVar8;
  iVar8 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_UNIFORM);
  __return_storage_ptr__->numUniformBlocks = iVar8;
  iVar8 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_BUFFER);
  __return_storage_ptr__->numShaderStorageBlocks = iVar8;
  SVar1 = shader->m_shaderType;
  if (SVar1 == SHADERTYPE_TESSELLATION_EVALUATION) {
    dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputs = dVar9 + iVar2;
    dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputVectors = dVar9 + iVar3;
    dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
    __return_storage_ptr__->numInputComponents = iVar4 + dVar9 * 4;
  }
  else {
    if (SVar1 == SHADERTYPE_TESSELLATION_CONTROL) {
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputs = dVar9 + iVar2;
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputVectors = dVar9 + iVar3;
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numInputComponents = iVar4 + dVar9 * 4;
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numOutputs = dVar9 + iVar5;
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      __return_storage_ptr__->numOutputVectors = dVar9 + iVar6;
      dVar9 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices(program);
      iVar7 = iVar7 + dVar9 * 4;
      goto LAB_016d5b9d;
    }
    if (SVar1 != SHADERTYPE_GEOMETRY) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->numInputs = iVar2 + 1;
    __return_storage_ptr__->numInputVectors = iVar3 + 1;
    __return_storage_ptr__->numInputComponents = iVar4 + 4;
  }
  __return_storage_ptr__->numOutputs = iVar5 + 1;
  __return_storage_ptr__->numOutputVectors = iVar6 + 1;
  iVar7 = iVar7 + 4;
LAB_016d5b9d:
  __return_storage_ptr__->numOutputComponents = iVar7;
  return __return_storage_ptr__;
}

Assistant:

ProgramInterfaceDefinition::ShaderResourceUsage getShaderResourceUsage (const ProgramInterfaceDefinition::Program* program, const ProgramInterfaceDefinition::Shader* shader)
{
	ProgramInterfaceDefinition::ShaderResourceUsage retVal;

	retVal.numInputs						= getNumTypeInstances(shader, glu::STORAGE_IN);
	retVal.numInputVectors					= getNumVectors(shader, glu::STORAGE_IN);
	retVal.numInputComponents				= getNumComponents(shader, glu::STORAGE_IN);

	retVal.numOutputs						= getNumTypeInstances(shader, glu::STORAGE_OUT);
	retVal.numOutputVectors					= getNumVectors(shader, glu::STORAGE_OUT);
	retVal.numOutputComponents				= getNumComponents(shader, glu::STORAGE_OUT);

	retVal.numPatchInputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_IN);
	retVal.numPatchOutputComponents			= getNumComponents(shader, glu::STORAGE_PATCH_OUT);

	retVal.numDefaultBlockUniformComponents	= getNumDefaultBlockComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numCombinedUniformComponents		= getNumComponents(shader, glu::STORAGE_UNIFORM);
	retVal.numUniformVectors				= getNumVectors(shader, glu::STORAGE_UNIFORM);

	retVal.numSamplers						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);
	retVal.numImages						= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

	retVal.numAtomicCounterBuffers			= getNumAtomicCounterBuffers(shader);
	retVal.numAtomicCounters				= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);

	retVal.numUniformBlocks					= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);
	retVal.numShaderStorageBlocks			= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

	// add builtins
	switch (shader->getType())
	{
		case glu::SHADERTYPE_VERTEX:
			// gl_Position is not counted
			break;

		case glu::SHADERTYPE_FRAGMENT:
			// nada
			break;

		case glu::SHADERTYPE_GEOMETRY:
			// gl_Position in (point mode => size 1)
			retVal.numInputs			+= 1;
			retVal.numInputVectors		+= 1;
			retVal.numInputComponents	+= 4;

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out, size = num patch out vertices
			retVal.numOutputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numOutputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();
			break;

		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			// gl_Position in is read up to gl_InstanceID
			retVal.numInputs			+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputVectors		+= 1 * program->getTessellationNumOutputPatchVertices();
			retVal.numInputComponents	+= 4 * program->getTessellationNumOutputPatchVertices();

			// gl_Position out
			retVal.numOutputs			+= 1;
			retVal.numOutputVectors		+= 1;
			retVal.numOutputComponents	+= 4;
			break;

		case glu::SHADERTYPE_COMPUTE:
			// nada
			break;

		default:
			DE_ASSERT(false);
			break;
	}
	return retVal;
}